

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O3

void __thiscall
Centaurus::ATNPrinter<char>::print(ATNPrinter<char> *this,wostream *os,Identifier *key)

{
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_48;
  
  print_atn_abi_cxx11_(&local_48,this,os,0,key);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48.second._M_dataplus._M_p != &local_48.second.field_2) {
    operator_delete(local_48.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48.first._M_dataplus._M_p != &local_48.first.field_2) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  return;
}

Assistant:

void print(std::wostream& os, const Identifier& key)
	{
		print_atn(os, 0, key);
	}